

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::STEP::EXPRESS::DataType> __thiscall
Assimp::STEP::EXPRESS::DataType::Parse
          (DataType *this,char **inout,uint64_t line,ConversionSchema *schema)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  Logger *this_00;
  double dVar5;
  char *pcVar6;
  SyntaxError *pSVar7;
  char cVar8;
  ulong uVar9;
  size_type sVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  char cVar12;
  int iVar13;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sVar14;
  string s;
  byte *local_50;
  double f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_50 = (byte *)*inout;
  SkipSpaces<char>((char **)&local_50);
  uVar9 = (ulong)*local_50;
  if ((uVar9 < 0x2d) && ((0x100100003601U >> (uVar9 & 0x3f) & 1) != 0)) {
    pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"unexpected token, expected parameter",(allocator<char> *)&f);
    SyntaxError::SyntaxError(pSVar7,&s,line);
    __cxa_throw(pSVar7,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (schema != (ConversionSchema *)0x0) {
    bVar2 = false;
    pbVar3 = local_50;
    while( true ) {
      cVar8 = (char)uVar9;
      if (((cVar8 == '\0') || (iVar13 = (int)uVar9, iVar13 == 0x2c)) || (iVar13 == 0x29))
      goto LAB_00597cd0;
      if (iVar13 == 0x28) break;
      bVar2 = (bool)(bVar2 | (cVar8 != '\t' && cVar8 != ' '));
      uVar9 = (ulong)pbVar3[1];
      pbVar3 = pbVar3 + 1;
    }
    if (bVar2) goto LAB_00597c28;
  }
LAB_00597cd0:
  pbVar3 = local_50;
  bVar1 = *local_50;
  switch(bVar1) {
  case 0x22:
    pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"binary data not supported yet",(allocator<char> *)&f);
    SyntaxError::SyntaxError(pSVar7,&s,line);
    __cxa_throw(pSVar7,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  case 0x23:
    local_50 = local_50 + 1;
    f = (double)strtoul10_64((char *)local_50,inout,(uint *)0x0);
    std::make_shared<Assimp::STEP::EXPRESS::ENTITY,unsigned_long>((unsigned_long *)&s);
    break;
  case 0x24:
    *inout = (char *)(local_50 + 1);
    std::make_shared<Assimp::STEP::EXPRESS::UNSET>();
    break;
  default:
    do {
      if (bVar1 < 0x2f) {
        if ((0x120100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
          bVar1 = *pbVar3;
          dVar5 = (double)strtoul10_64((char *)(pbVar3 + (bVar1 == 0x2b || bVar1 == 0x2d)),inout,
                                       (uint *)0x0);
          f = (double)-(long)dVar5;
          if (bVar1 != 0x2d) {
            f = dVar5;
          }
          std::make_shared<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,long>((long *)&s);
          break;
        }
        if ((ulong)bVar1 == 0x2e) goto LAB_00597ef2;
      }
      bVar1 = local_50[1];
      local_50 = local_50 + 1;
    } while( true );
  case 0x27:
    while( true ) {
      local_50 = local_50 + 1;
      if (*local_50 == 0x27) break;
      if (*local_50 == 0) {
        pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,"string literal not closed",(allocator<char> *)&f);
        SyntaxError::SyntaxError(pSVar7,&s,line);
        __cxa_throw(pSVar7,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    while (local_50[1] == 0x27) {
      for (local_50 = local_50 + 2; *local_50 != 0x27; local_50 = local_50 + 1) {
        if (*local_50 == 0) {
          pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&s,"string literal not closed",(allocator<char> *)&f);
          SyntaxError::SyntaxError(pSVar7,&s,line);
          __cxa_throw(pSVar7,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    *inout = (char *)(local_50 + 1);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s);
    bVar2 = StringToUTF8(&s);
    if (!bVar2) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"an error occurred reading escape sequences in ASCII text");
    }
    std::
    make_shared<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
    goto LAB_00597e61;
  case 0x28:
    *inout = (char *)local_50;
    LIST::Parse((char **)&s,(uint64_t)inout,(ConversionSchema *)line);
    break;
  case 0x2a:
    *inout = (char *)(local_50 + 1);
    std::make_shared<Assimp::STEP::EXPRESS::ISDERIVED>();
    break;
  case 0x2e:
    while( true ) {
      local_50 = pbVar3 + 1;
      if (*local_50 == 0x2e) break;
      pbVar3 = local_50;
      if (*local_50 == 0) {
        pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,"enum not closed",(allocator<char> *)&f);
        SyntaxError::SyntaxError(pSVar7,&s,line);
        __cxa_throw(pSVar7,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    *inout = (char *)(pbVar3 + 2);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s);
    std::make_shared<Assimp::STEP::EXPRESS::ENUMERATION,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
LAB_00597e61:
    _Var11._M_pi = a_Stack_40[0]._M_pi;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->_vptr_DataType = (_func_int **)f;
    this[1]._vptr_DataType = (_func_int **)_Var11._M_pi;
    f = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
LAB_00597e7b:
    std::__cxx11::string::~string((string *)&s);
    _Var11._M_pi = extraout_RDX;
    goto LAB_00597ee0;
  }
LAB_00597ec6:
  sVar10 = s._M_string_length;
  s._M_string_length = 0;
  this->_vptr_DataType = (_func_int **)s._M_dataplus._M_p;
  this[1]._vptr_DataType = (_func_int **)sVar10;
  s._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
  _Var11._M_pi = extraout_RDX_00;
LAB_00597ee0:
  sVar14.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var11._M_pi;
  sVar14.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<const_Assimp::STEP::EXPRESS::DataType>)
         sVar14.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>;
LAB_00597c28:
  do {
    do {
      pbVar4 = pbVar3;
      pbVar3 = pbVar4 + -1;
    } while (pbVar4[-1] == 9);
  } while (pbVar4[-1] == 0x20);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,local_50,pbVar4);
  for (sVar10 = 0; s._M_string_length != sVar10; sVar10 = sVar10 + 1) {
    cVar8 = s._M_dataplus._M_p[sVar10];
    cVar12 = cVar8 + ' ';
    if (0x19 < (byte)(cVar8 + 0xbfU)) {
      cVar12 = cVar8;
    }
    s._M_dataplus._M_p[sVar10] = cVar12;
  }
  bVar2 = ConversionSchema::IsKnownToken(schema,&s);
  if (!bVar2) {
    std::__cxx11::string::~string((string *)&s);
    goto LAB_00597cd0;
  }
  do {
    local_50 = pbVar4 + 1;
    bVar1 = *pbVar4;
    pbVar4 = local_50;
  } while (bVar1 != 0x28);
  Parse(this,(char **)&local_50,0xffffffffffffffff,(ConversionSchema *)0x0);
  *inout = (char *)(local_50 + (*local_50 != 0));
  goto LAB_00597e7b;
LAB_00597ef2:
  pcVar6 = fast_atoreal_move<double>((char *)pbVar3,&f,true);
  *inout = pcVar6;
  std::make_shared<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,double&>((double *)&s);
  goto LAB_00597ec6;
}

Assistant:

std::shared_ptr<const EXPRESS::DataType> EXPRESS::DataType::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/)
{
    const char* cur = inout;
    SkipSpaces(&cur);
    if (*cur == ',' || IsSpaceOrNewLine(*cur)) {
        throw STEP::SyntaxError("unexpected token, expected parameter",line);
    }

    // just skip over constructions such as IFCPLANEANGLEMEASURE(0.01) and read only the value
    if (schema) {
        bool ok = false;
        for(const char* t = cur; *t && *t != ')' && *t != ','; ++t) {
            if (*t=='(') {
                if (!ok) {
                    break;
                }
                for(--t;IsSpace(*t);--t);
                std::string s(cur,static_cast<size_t>(t-cur+1));
                std::transform(s.begin(),s.end(),s.begin(),&ToLower<char> );
                if (schema->IsKnownToken(s)) {
                    for(cur = t+1;*cur++ != '(';);
                    const std::shared_ptr<const EXPRESS::DataType> dt = Parse(cur);
                    inout = *cur ? cur+1 : cur;
                    return dt;
                }
                break;
            }
            else if (!IsSpace(*t)) {
                ok = true;
            }
        }
    }

    if (*cur == '*' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::ISDERIVED>();
    }
    else if (*cur == '$' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::UNSET>();
    }
    else if (*cur == '(' ) {
        // start of an aggregate, further parsing is done by the LIST factory constructor
        inout = cur;
        return EXPRESS::LIST::Parse(inout,line,schema);
    }
    else if (*cur == '.' ) {
        // enum (includes boolean)
        const char* start = ++cur;
        for(;*cur != '.';++cur) {
            if (*cur == '\0') {
                throw STEP::SyntaxError("enum not closed",line);
            }
        }
        inout = cur+1;
        return std::make_shared<EXPRESS::ENUMERATION>(std::string(start, static_cast<size_t>(cur-start) ));
    }
    else if (*cur == '#' ) {
        // object reference
        return std::make_shared<EXPRESS::ENTITY>(strtoul10_64(++cur,&inout));
    }
    else if (*cur == '\'' ) {
        // string literal
        const char* start = ++cur;

        for(;*cur != '\'';++cur)    {
            if (*cur == '\0')   {
                throw STEP::SyntaxError("string literal not closed",line);
            }
        }

        if (cur[1] == '\'') {
            // Vesanen: more than 2 escaped ' in one literal!
            do  {
                for(cur += 2;*cur != '\'';++cur)    {
                    if (*cur == '\0')   {
                        throw STEP::SyntaxError("string literal not closed",line);
                    }
                }
            }
            while(cur[1] == '\'');
        }

        inout = cur + 1;

        // assimp is supposed to output UTF8 strings, so we have to deal
        // with foreign encodings.
        std::string stemp = std::string(start, static_cast<size_t>(cur - start));
        if(!StringToUTF8(stemp)) {
            // TODO: route this to a correct logger with line numbers etc., better error messages
            ASSIMP_LOG_ERROR("an error occurred reading escape sequences in ASCII text");
        }

        return std::make_shared<EXPRESS::STRING>(stemp);
    }
    else if (*cur == '\"' ) {
        throw STEP::SyntaxError("binary data not supported yet",line);
    }

    // else -- must be a number. if there is a decimal dot in it,
    // parse it as real value, otherwise as integer.
    const char* start = cur;
    for(;*cur  && *cur != ',' && *cur != ')' && !IsSpace(*cur);++cur) {
        if (*cur == '.') {
            double f;
            inout = fast_atoreal_move<double>(start,f);
            return std::make_shared<EXPRESS::REAL>(f);
        }
    }

    bool neg = false;
    if (*start == '-') {
        neg = true;
        ++start;
    }
    else if (*start == '+') {
        ++start;
    }
    int64_t num = static_cast<int64_t>( strtoul10_64(start,&inout) );
    return std::make_shared<EXPRESS::INTEGER>(neg?-num:num);
}